

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O3

string * gmlc::networking::getLocalExternalAddressV4_abi_cxx11_(void)

{
  undefined8 *puVar1;
  pointer pcVar2;
  string *psVar3;
  size_type this;
  _Alloc_hider __s2;
  size_type __n;
  undefined8 uVar4;
  int iVar5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  error_code ec;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  resolver resolver;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  error_code local_128;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  __native_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_e8[0]._M_allocated_capacity = 0;
  local_e8[0]._M_local_buf[8] = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_118._40_8_ = local_e8[0]._M_local_buf + 8;
  AsioContextManager::getContextPointer
            ((AsioContextManager *)local_118,(string *)(local_118 + 0x28));
  if ((char *)local_118._40_8_ != local_e8[0]._M_local_buf + 8) {
    operator_delete((void *)local_118._40_8_,
                    CONCAT71(local_e8[0]._9_7_,local_e8[0]._M_local_buf[8]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_118._0_8_ + 0x40));
  local_128._M_value = 2;
  asio::ip::host_name_abi_cxx11_();
  local_148._0_8_ = &aStack_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)(local_118 + 0x28),(protocol_type *)&local_128,
             &local_188,(string *)local_148,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &aStack_138) {
    operator_delete((void *)local_148._0_8_,aStack_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  local_128._M_value = 0;
  local_128._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            ((results_type *)&local_188,local_80.service_,&local_80.implementation_,
             (query_type *)(local_118 + 0x28),&local_128);
  this = local_188._M_string_length;
  iVar5 = extraout_EDX;
  if (local_128._M_value == 0) {
    sVar6 = *(size_type *)local_188._M_dataplus._M_p;
    lVar8 = CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,local_188.field_2._M_local_buf[0]
                    ) * 0x60;
    local_148._4_4_ = *(undefined4 *)(sVar6 + 4 + lVar8);
    puVar1 = (undefined8 *)(sVar6 + 8 + lVar8);
    local_118._16_8_ = *puVar1;
    local_118._24_8_ = puVar1[1];
    local_148[0] = *(short *)(sVar6 + lVar8) != 2;
    if ((bool)local_148[0]) {
      aStack_138._8_4_ = *(undefined4 *)(sVar6 + 0x18 + lVar8);
      local_148._4_4_ = 0;
      local_148._8_8_ = local_118._16_8_;
      aStack_138._M_allocated_capacity = local_118._24_8_;
    }
    else {
      local_148._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      aStack_138._M_allocated_capacity = 0;
      aStack_138._8_4_ = 0;
    }
    local_148._1_3_ = 0;
    asio::ip::address::to_string_abi_cxx11_(&local_188,(address *)local_148);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188);
    iVar5 = extraout_EDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
      iVar5 = extraout_EDX_01;
    }
  }
  netif::getInterfaceAddresses_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148,(netif *)0x2,iVar5);
  uVar4 = local_148._8_8_;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_148._0_8_;
  __n = local_168._M_string_length;
  __s2._M_p = local_168._M_dataplus._M_p;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_148._0_8_;
  if (local_148._0_8_ == local_148._8_8_) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_168._M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p == &local_168.field_2) {
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                      local_168.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_168.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_168._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                      local_168.field_2._M_local_buf[0]);
      }
LAB_00405e12:
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      in_RDI->_M_string_length = __n;
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
    }
  }
  else {
    do {
      if ((*(size_t *)(paVar9->_M_local_buf + 8) == __n) &&
         ((__n == 0 ||
          (iVar5 = bcmp((void *)paVar9->_M_allocated_capacity,__s2._M_p,__n), iVar5 == 0)))) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s2._M_p == &local_168.field_2) {
          (in_RDI->field_2)._M_allocated_capacity =
               CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                        local_168.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_168.field_2._8_8_;
        }
        else {
          (in_RDI->_M_dataplus)._M_p = __s2._M_p;
          (in_RDI->field_2)._M_allocated_capacity =
               CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                        local_168.field_2._M_local_buf[0]);
        }
        goto LAB_00405e12;
      }
      paVar9 = paVar9 + 2;
    } while (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)uVar4);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    paVar9 = &in_RDI->field_2;
    do {
      (in_RDI->_M_dataplus)._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>();
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        (in_RDI,"127.",0,4);
      if (sVar6 != 0) {
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(in_RDI,"169.254.",0,8);
        if (sVar6 != 0) goto LAB_00405f41;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        }
      }
      pcVar2 = (in_RDI->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar9) {
        operator_delete(pcVar2,paVar9->_M_allocated_capacity + 1);
      }
      paVar7 = paVar7 + 2;
    } while (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)uVar4);
    (in_RDI->_M_dataplus)._M_p = (pointer)paVar9;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_168.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p == paVar7) {
        paVar9->_M_allocated_capacity =
             CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                      local_168.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_168.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_168._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                      local_168.field_2._M_local_buf[0]);
      }
      psVar3 = (string *)&local_168;
      in_RDI->_M_string_length = local_168._M_string_length;
      local_168._M_dataplus._M_p = (pointer)paVar7;
    }
    else {
      paVar7 = &local_188.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar7) {
        paVar9->_M_allocated_capacity =
             CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                      local_188.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_188.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_188._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                      local_188.field_2._M_local_buf[0]);
      }
      psVar3 = &local_188;
      in_RDI->_M_string_length = local_188._M_string_length;
      local_188._M_dataplus._M_p = (pointer)paVar7;
    }
    psVar3->_M_string_length = 0;
    paVar7->_M_local_buf[0] = '\0';
LAB_00405f41:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.__data.__list.__next != &local_90) {
    operator_delete(local_c0.__data.__list.__next,(ulong)(local_90._M_allocated_capacity + 1));
  }
  if ((char *)local_c0.__align != local_c0.__size + 0x10) {
    operator_delete((void *)local_c0.__align,local_c0._16_8_ + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

std::string getLocalExternalAddressV4()
{
    std::string resolved_address;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    if (!ec) {
        asio::ip::tcp::endpoint endpoint = *it;
        resolved_address = endpoint.address().to_string();
    }
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        if (resolved_address.empty()) {
            return "0.0.0.0";
        }
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    for (const auto& addr : interface_addresses) {
        if (addr == resolved_address) {
            return resolved_address;
        }
    }

    // Pick an interface that isn't an IPv4 loopback address, 127.0.0.1/8
    // or an IPv4 link-local address, 169.254.0.0/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr.rfind("127.", 0) != 0) {
            if (addr.rfind("169.254.", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // Return a link-local address since no alternatives were found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}